

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::EnumLiteGenerator::Generate
          (EnumLiteGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool immutable;
  Context *context;
  string *value1;
  Printer *pPVar2;
  mapped_type *pmVar3;
  EnumDescriptor *pEVar4;
  pointer ppEVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar6;
  int extraout_EDX_01;
  int extraout_EDX_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_a8;
  Printer *local_88;
  undefined1 local_80 [32];
  _Base_ptr local_60;
  size_t local_58;
  key_type local_50;
  
  WriteEnumDocComment(printer,this->descriptor_);
  context = this->context_;
  pEVar4 = this->descriptor_;
  immutable = this->immutable_api_;
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"");
  MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
            (context,printer,pEVar4,immutable,(string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  io::Printer::Print(printer,
                     "public enum $classname$\n    implements com.google.protobuf.Internal.EnumLite {\n"
                     ,"classname",*(string **)this->descriptor_);
  io::Printer::Annotate<google::protobuf::EnumDescriptor>
            (printer,"classname","classname",this->descriptor_);
  local_88 = printer;
  io::Printer::Indent(printer);
  if ((this->canonical_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->canonical_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar1 = &local_a8.field_2;
    uVar8 = 0;
    do {
      local_80._8_4_ = _S_red;
      local_80._16_8_ = 0;
      local_80._24_8_ = local_80 + 8;
      local_58 = 0;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      local_60 = (_Base_ptr)local_80._24_8_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"name","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_80,&local_a8);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      iVar6 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        iVar6 = extraout_EDX_00;
      }
      SimpleItoa_abi_cxx11_
                (&local_a8,
                 (protobuf *)
                 (ulong)*(uint *)((this->canonical_values_).
                                  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar8] + 0x10),iVar6);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"number","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_80,&local_50);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      WriteEnumValueDocComment
                (local_88,(this->canonical_values_).
                          super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar8]);
      if (*(char *)(*(long *)((this->canonical_values_).
                              super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar8] + 0x20) + 0x68) ==
          '\x01') {
        io::Printer::Print(local_88,"@java.lang.Deprecated\n");
      }
      io::Printer::Print(local_88,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_80,"$name$($number$),\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_80);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)(this->canonical_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->canonical_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pPVar2 = local_88;
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
    io::Printer::Print(local_88,"UNRECOGNIZED(-1),\n");
  }
  io::Printer::Print(pPVar2,";\n\n");
  if ((this->aliases_).
      super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->aliases_).
      super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      local_80._8_4_ = _S_red;
      local_80._16_8_ = 0;
      local_80._24_8_ = local_80 + 8;
      local_58 = 0;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_60 = (_Base_ptr)local_80._24_8_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"classname","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_80,&local_a8);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"name","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_80,&local_a8);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"canonical_name","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_80,&local_a8);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      pPVar2 = local_88;
      WriteEnumValueDocComment
                (local_88,*(EnumValueDescriptor **)
                           ((long)&((this->aliases_).
                                    super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->value + lVar9));
      io::Printer::Print(pPVar2,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_80,
                         "public static final $classname$ $name$ = $canonical_name$;\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_80);
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (ulong)((long)(this->aliases_).
                                   super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->aliases_).
                                   super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (0 < *(int *)(this->descriptor_ + 0x2c)) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      local_80._8_4_ = _S_red;
      local_80._16_8_ = 0;
      local_80._24_8_ = local_80 + 8;
      local_58 = 0;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_60 = (_Base_ptr)local_80._24_8_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"name","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_80,&local_a8);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      iVar6 = extraout_EDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        iVar6 = extraout_EDX_02;
      }
      SimpleItoa_abi_cxx11_
                (&local_a8,
                 (protobuf *)(ulong)*(uint *)(*(long *)(this->descriptor_ + 0x30) + 0x10 + lVar9),
                 iVar6);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"number","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_80,&local_50);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      pPVar2 = local_88;
      WriteEnumValueDocComment
                (local_88,(EnumValueDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar9));
      io::Printer::Print(pPVar2,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_80,"public static final int $name$_VALUE = $number$;\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_80);
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x28;
    } while (lVar10 < *(int *)(this->descriptor_ + 0x2c));
  }
  pPVar2 = local_88;
  io::Printer::Print(local_88,"\n");
  io::Printer::Print(pPVar2,"\npublic final int getNumber() {\n");
  pEVar4 = this->descriptor_;
  if (*(int *)(*(long *)(pEVar4 + 0x10) + 0x8c) == 3) {
    io::Printer::Print(pPVar2,
                       "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
                      );
    pEVar4 = this->descriptor_;
  }
  io::Printer::Print(pPVar2,
                     "  return value;\n}\n\n/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $classname$ valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $classname$ forNumber(int value) {\n  switch (value) {\n"
                     ,"classname",*(string **)pEVar4);
  io::Printer::Indent(pPVar2);
  io::Printer::Indent(pPVar2);
  ppEVar5 = (this->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->canonical_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar5) {
    uVar8 = 0;
    uVar7 = extraout_RDX;
    do {
      value1 = *(string **)ppEVar5[uVar8];
      SimpleItoa_abi_cxx11_
                ((string *)local_80,(protobuf *)(ulong)*(uint *)(ppEVar5[uVar8] + 0x10),(int)uVar7);
      io::Printer::Print(local_88,"case $number$: return $name$;\n","name",value1,"number",
                         (string *)local_80);
      uVar7 = extraout_RDX_00;
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        uVar7 = extraout_RDX_01;
      }
      uVar8 = uVar8 + 1;
      ppEVar5 = (this->canonical_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->canonical_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >> 3))
    ;
  }
  pPVar2 = local_88;
  io::Printer::Outdent(local_88);
  io::Printer::Outdent(pPVar2);
  io::Printer::Print(pPVar2,
                     "    default: return null;\n  }\n}\n\npublic static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n    internalGetValueMap() {\n  return internalValueMap;\n}\nprivate static final com.google.protobuf.Internal.EnumLiteMap<\n    $classname$> internalValueMap =\n      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n        public $classname$ findValueByNumber(int number) {\n          return $classname$.forNumber(number);\n        }\n      };\n\n"
                     ,"classname",*(string **)this->descriptor_);
  io::Printer::Print(pPVar2,"private final int value;\n\nprivate $classname$(int value) {\n",
                     "classname",*(string **)this->descriptor_);
  io::Printer::Print(pPVar2,"  this.value = value;\n}\n");
  io::Printer::Print(pPVar2,"\n// @@protoc_insertion_point(enum_scope:$full_name$)\n","full_name",
                     *(string **)(this->descriptor_ + 8));
  io::Printer::Outdent(pPVar2);
  io::Printer::Print(pPVar2,"}\n\n");
  return;
}

Assistant:

void EnumLiteGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_, immutable_api_);
  printer->Print(
      "public enum $classname$\n"
      "    implements com.google.protobuf.Internal.EnumLite {\n",
      "classname", descriptor_->name());
  printer->Annotate("classname", descriptor_);
  printer->Indent();

  for (int i = 0; i < canonical_values_.size(); i++) {
    std::map<string, string> vars;
    vars["name"] = canonical_values_[i]->name();
    vars["number"] = SimpleItoa(canonical_values_[i]->number());
    WriteEnumValueDocComment(printer, canonical_values_[i]);
    if (canonical_values_[i]->options().deprecated()) {
      printer->Print("@java.lang.Deprecated\n");
    }
    printer->Print(vars,
      "$name$($number$),\n");
  }

  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print("UNRECOGNIZED(-1),\n");
  }

  printer->Print(
    ";\n"
    "\n");

  // -----------------------------------------------------------------

  for (int i = 0; i < aliases_.size(); i++) {
    std::map<string, string> vars;
    vars["classname"] = descriptor_->name();
    vars["name"] = aliases_[i].value->name();
    vars["canonical_name"] = aliases_[i].canonical_value->name();
    WriteEnumValueDocComment(printer, aliases_[i].value);
    printer->Print(vars,
      "public static final $classname$ $name$ = $canonical_name$;\n");
  }

  for (int i = 0; i < descriptor_->value_count(); i++) {
    std::map<string, string> vars;
    vars["name"] = descriptor_->value(i)->name();
    vars["number"] = SimpleItoa(descriptor_->value(i)->number());
    WriteEnumValueDocComment(printer, descriptor_->value(i));
    printer->Print(vars,
      "public static final int $name$_VALUE = $number$;\n");
  }
  printer->Print("\n");

  // -----------------------------------------------------------------

  printer->Print(
      "\n"
      "public final int getNumber() {\n");
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(
        "  if (this == UNRECOGNIZED) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "        \"Can't get the number of an unknown enum value.\");\n"
        "  }\n");
  }
  printer->Print(
      "  return value;\n"
      "}\n"
      "\n"
      "/**\n"
      " * @deprecated Use {@link #forNumber(int)} instead.\n"
      " */\n"
      "@java.lang.Deprecated\n"
      "public static $classname$ valueOf(int value) {\n"
      "  return forNumber(value);\n"
      "}\n"
      "\n"
      "public static $classname$ forNumber(int value) {\n"
      "  switch (value) {\n",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < canonical_values_.size(); i++) {
    printer->Print(
      "case $number$: return $name$;\n",
      "name", canonical_values_[i]->name(),
      "number", SimpleItoa(canonical_values_[i]->number()));
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "    default: return null;\n"
    "  }\n"
    "}\n"
    "\n"
    "public static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n"
    "    internalGetValueMap() {\n"
    "  return internalValueMap;\n"
    "}\n"
    "private static final com.google.protobuf.Internal.EnumLiteMap<\n"
    "    $classname$> internalValueMap =\n"
    "      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n"
    "        public $classname$ findValueByNumber(int number) {\n"
    "          return $classname$.forNumber(number);\n"
    "        }\n"
    "      };\n"
    "\n",
    "classname", descriptor_->name());

  printer->Print(
    "private final int value;\n\n"
    "private $classname$(int value) {\n",
    "classname", descriptor_->name());
  printer->Print(
    "  this.value = value;\n"
    "}\n");

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(enum_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}